

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O2

void __thiscall f8n::runtime::MessageQueue::~MessageQueue(MessageQueue *this)

{
  (this->super_IMessageQueue)._vptr_IMessageQueue = (_func_int **)&PTR__MessageQueue_0021c8d8;
  std::_V2::condition_variable_any::~condition_variable_any(&this->waitForDispatch);
  std::
  _Rb_tree<f8n::runtime::IMessageTarget_*,_f8n::runtime::IMessageTarget_*,_std::_Identity<f8n::runtime::IMessageTarget_*>,_std::less<f8n::runtime::IMessageTarget_*>,_std::allocator<f8n::runtime::IMessageTarget_*>_>
  ::~_Rb_tree(&(this->targets)._M_t);
  std::
  _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,_std::weak_ptr<f8n::runtime::IMessageTarget>,_std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>_>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  ::~_Rb_tree(&(this->receivers)._M_t);
  std::__cxx11::
  _List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
  ::_M_clear(&(this->dispatch).
              super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
            );
  std::__cxx11::
  _List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
  ::_M_clear(&(this->queue).
              super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
            );
  return;
}

Assistant:

MessageQueue::~MessageQueue() {

}